

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobHashTable.h
# Opt level: O0

void __thiscall
ValueHashTable<Sym_*,_Value_*>::ValueHashTable
          (ValueHashTable<Sym_*,_Value_*> *this,JitArenaAllocator *allocator,uint tableSize)

{
  char *name;
  DictionaryStats *pDVar1;
  uint tableSize_local;
  JitArenaAllocator *allocator_local;
  ValueHashTable<Sym_*,_Value_*> *this_local;
  
  this->alloc = allocator;
  this->tableSize = tableSize;
  Init(this);
  name = std::type_info::name((type_info *)&ValueHashTable<Sym*,Value*>*::typeinfo);
  pDVar1 = DictionaryStats::Create(name,tableSize);
  this->stats = pDVar1;
  return;
}

Assistant:

ValueHashTable(JitArenaAllocator * allocator, uint tableSize) : alloc(allocator), tableSize(tableSize)
    {
        Init();
#if PROFILE_DICTIONARY
        stats = DictionaryStats::Create(typeid(this).name(), tableSize);
#endif
    }